

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_deserialize_field
          (t_ocaml_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  string name;
  string local_70;
  string local_50;
  
  type = tfield->type_;
  std::__cxx11::string::string((string *)&local_50,(string *)&tfield->name_);
  t_generator::decapitalize(&local_70,(t_generator *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,"#set_");
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  std::operator<<(poVar1," ");
  generate_deserialize_type(this,out,type);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_ocaml_generator::generate_deserialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = tfield->get_type();

  string name = decapitalize(tfield->get_name());
  indent(out) << prefix << "#set_" << name << " ";
  generate_deserialize_type(out, type);
  out << endl;
}